

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-parse.c
# Opt level: O0

int fy_attach_comments_if_any(fy_parser *fyp,fy_token *fyt)

{
  _Bool _Var1;
  int c_00;
  int rc;
  int c;
  fy_token *fyt_local;
  fy_parser *fyp_local;
  
  if ((fyp == (fy_parser *)0x0) || (fyt == (fy_token *)0x0)) {
    fyp_local._4_4_ = -1;
  }
  else {
    if ((((fyp->cfg).flags & FYPCF_PARSE_COMMENTS) != FYPCF_COLOR_AUTO) &&
       (_Var1 = fy_atom_is_set(&fyp->last_comment), _Var1)) {
      memcpy(fyt->comment,&fyp->last_comment,0x38);
      memset(&fyp->last_comment,0,0x38);
    }
    while( true ) {
      c_00 = fy_parse_peek(fyp);
      _Var1 = fy_is_ws(c_00);
      if (!_Var1) break;
      fy_advance(fyp,c_00);
    }
    if ((c_00 == 0x23) &&
       (fyp_local._4_4_ = fy_scan_comment(fyp,fyt->comment + 1,false), fyp_local._4_4_ != 0)) {
      fy_parser_diag(fyp,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                     ,700,"fy_attach_comments_if_any","fy_scan_comment() failed");
    }
    else {
      fyp_local._4_4_ = 0;
    }
  }
  return fyp_local._4_4_;
}

Assistant:

int fy_attach_comments_if_any(struct fy_parser *fyp, struct fy_token *fyt) {
    int c, rc;

    if (!fyp || !fyt)
        return -1;

    /* if a last comment exists and is valid */
    if ((fyp->cfg.flags & FYPCF_PARSE_COMMENTS) &&
        fy_atom_is_set(&fyp->last_comment)) {
        memcpy(&fyt->comment[fycp_top], &fyp->last_comment, sizeof(fyp->last_comment));
        memset(&fyp->last_comment, 0, sizeof(fyp->last_comment));
    }

    /* right hand comment */

    /* skip white space */
    while (fy_is_ws(c = fy_parse_peek(fyp)))
        fy_advance(fyp, c);

    if (c == '#') {
        rc = fy_scan_comment(fyp, &fyt->comment[fycp_right], false);
        fyp_error_check(fyp, !rc, err_out_rc,
                        "fy_scan_comment() failed");
    }
    return 0;

    err_out_rc:
    return rc;
}